

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Object * json::Json::createObject(Object *__return_storage_ptr__,Node *O)

{
  _Rb_tree_header *p_Var1;
  const_reference RS;
  
  (__return_storage_ptr__->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00132ca0;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RS = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&(O->production).nodes,1);
  nextRecord(__return_storage_ptr__,RS);
  return __return_storage_ptr__;
}

Assistant:

static Object createObject(parser::Node const& O) {
            Object object;
            parser::Node const& RS = O.getProduction().nodes.at(1);
            nextRecord(object, RS);
            return object;
        }